

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall fmt::v10::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  int iVar2;
  
  if (this == divisor) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                ,0xbcc,"");
  }
  iVar1 = compare(this,divisor);
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  else {
    if ((divisor->bigits_).super_buffer<unsigned_int>.ptr_
        [(divisor->bigits_).super_buffer<unsigned_int>.size_ - 1] == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                  ,0xbce,"");
    }
    align(this,divisor);
    iVar1 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar1 = iVar1 + 1;
      iVar2 = compare(this,divisor);
    } while (-1 < iVar2);
  }
  return iVar1;
}

Assistant:

FMT_CONSTEXPR20 int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    align(divisor);
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }